

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2608_reset_chip(void *chip)

{
  FM_OPN *OPN_00;
  YM_DELTAT *DELTAT;
  FM_OPN *OPN;
  YM2608 *F2608;
  int i;
  void *chip_local;
  
  OPN_00 = (FM_OPN *)((long)chip + 0x208);
  OPNPrescaler_w(OPN_00,0,2);
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  (**(code **)((long)chip + 0x670))(*(undefined8 *)((long)chip + 0x678));
  YM2608IRQMaskWrite(OPN_00,(YM2608 *)chip,0x1f);
  YM2608IRQFlagWrite(OPN_00,(YM2608 *)chip,0x1c);
  *(undefined4 *)((long)chip + 0x6dc) = 0;
  *(undefined4 *)((long)chip + 0x6d8) = 0;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  *(undefined4 *)((long)chip + 0x244) = 0;
  *(undefined1 *)((long)chip + 0x69c) = 0;
  *(undefined1 *)((long)chip + 0x22f) = 0;
  *(undefined4 *)((long)chip + 0x230) = 0;
  *(undefined1 *)((long)chip + 0x22d) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  reset_channels((FM_ST *)((long)chip + 0x210),(FM_CH *)((long)chip + 0x4778),6);
  for (F2608._4_4_ = 0xb6; 0xb3 < (int)F2608._4_4_; F2608._4_4_ = F2608._4_4_ - 1) {
    OPNWriteReg(OPN_00,F2608._4_4_,0xc0);
    OPNWriteReg(OPN_00,F2608._4_4_ | 0x100,0xc0);
  }
  for (F2608._4_4_ = 0xb2; 0x2f < (int)F2608._4_4_; F2608._4_4_ = F2608._4_4_ - 1) {
    OPNWriteReg(OPN_00,F2608._4_4_,0);
    OPNWriteReg(OPN_00,F2608._4_4_ | 0x100,0);
  }
  OPNWriteMode(OPN_00,0x27,0x30);
  for (F2608._4_4_ = 0x26; 0x1f < (int)F2608._4_4_; F2608._4_4_ = F2608._4_4_ + -1) {
    OPNWriteReg(OPN_00,F2608._4_4_,0);
  }
  for (F2608._4_4_ = 0; (int)F2608._4_4_ < 6; F2608._4_4_ = F2608._4_4_ + 1) {
    if ((int)F2608._4_4_ < 4) {
      *(int *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x512c) =
           (int)(long)(((float)*(double *)((long)chip + 0x220) * 65536.0) / 3.0);
    }
    else {
      *(int *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x512c) =
           (int)(long)(((float)*(double *)((long)chip + 0x220) * 65536.0) / 6.0);
    }
    *(uint *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5130) =
         YM2608_ADPCM_ROM_addr[(int)(F2608._4_4_ << 1)];
    *(uint *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5134) =
         YM2608_ADPCM_ROM_addr[(int)(F2608._4_4_ * 2 + 1)];
    *(undefined4 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5124) = 0;
    *(undefined4 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5128) = 0;
    *(undefined1 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5148) = 0;
    *(long *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5150) = (long)chip + 0x4738;
    *(undefined1 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5121) = 0;
    *(undefined1 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5120) = 0;
    *(undefined4 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x513c) = 0;
    *(undefined4 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5140) = 0;
    *(undefined4 *)((long)chip + (long)(int)F2608._4_4_ * 0x40 + 0x5144) = 0;
  }
  *(undefined1 *)((long)chip + 0x511c) = 0x3f;
  *(undefined1 *)((long)chip + 0x5360) = 0;
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  YM_DELTAT_ADPCM_Reset((YM_DELTAT *)((long)chip + 0x5368),3);
  return;
}

Assistant:

void ym2608_reset_chip(void *chip)
{
	int i;
	YM2608 *F2608 = (YM2608 *)chip;
	FM_OPN *OPN   = &F2608->OPN;
	YM_DELTAT *DELTAT = &F2608->deltaT;

	/* Reset Prescaler */
	OPNPrescaler_w(OPN , 0 , 2);
	F2608->deltaT.freqbase = OPN->ST.freqbase;
	/* reset SSG section */
	OPN->ST.SSG_funcs.reset(OPN->ST.SSG_param);

	/* status clear */
	FM_BUSY_CLEAR(&OPN->ST);

	/* register 0x29 - default value after reset is:
		enable only 3 FM channels and enable all the status flags */
	YM2608IRQMaskWrite(OPN, F2608, 0x1f );  /* default value for D4-D0 is 1 */

	/* register 0x10, A1=1 - default value is 1 for D4, D3, D2, 0 for the rest */
	YM2608IRQFlagWrite(OPN, F2608, 0x1c );  /* default: enable timer A and B, disable EOS, BRDY and ZERO */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;
	OPN->ST.irq = 0;

	memset(F2608->REGS, 0x00, sizeof(UINT8) * 512);

	reset_channels( &OPN->ST , F2608->CH , 6 );
	/* reset Operator paramater */
	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}
	OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */
	for(i = 0x26 ; i >= 0x20 ; i-- ) OPNWriteReg(OPN,i,0);

	/* ADPCM - percussion sounds */
	for( i = 0; i < 6; i++ )
	{
		if (i<=3)   /* channels 0,1,2,3 */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/3.0);
		else        /* channels 4 and 5 work with slower clock */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/6.0);

		F2608->adpcm[i].start     = YM2608_ADPCM_ROM_addr[i*2];
		F2608->adpcm[i].end       = YM2608_ADPCM_ROM_addr[i*2+1];

		F2608->adpcm[i].now_addr  = 0;
		F2608->adpcm[i].now_step  = 0;
		// F2608->adpcm[i].delta     = 21866;
		F2608->adpcm[i].vol_mul   = 0;
		F2608->adpcm[i].pan       = &OPN->out_adpcm[OUTD_CENTER]; /* default center */
		F2608->adpcm[i].flagMask  = 0;
		F2608->adpcm[i].flag      = 0;
		F2608->adpcm[i].adpcm_acc = 0;
		F2608->adpcm[i].adpcm_step= 0;
		F2608->adpcm[i].adpcm_out = 0;
	}
	F2608->adpcmTL = 0x3f;

	F2608->adpcm_arrivedEndAddress = 0; /* not used */

	/* DELTA-T unit */
	DELTAT->freqbase = OPN->ST.freqbase;
	YM_DELTAT_ADPCM_Reset(DELTAT,OUTD_CENTER);
}